

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O3

void run_benchmark(testing t)

{
  double dVar1;
  uint uVar2;
  char *__ptr;
  char *__ptr_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  double dVar7;
  double d;
  nsync_time nVar8;
  
  iVar4 = t->base->longshort;
  if (iVar4 < 0) {
    uVar2 = 2000 >> (-(byte)iVar4 & 0x1f);
  }
  else {
    if (iVar4 == 0) {
      dVar7 = 2.0;
      goto LAB_001046ec;
    }
    uVar2 = 2000 << ((byte)iVar4 & 0x1f);
  }
  dVar7 = (double)(int)uVar2 * 0.001;
LAB_001046ec:
  iVar4 = 1;
  do {
    t->test_status = 0;
    t->n = iVar4;
    (t->stop_time).tv_sec = 0;
    (t->stop_time).tv_nsec = 0;
    nVar8 = nsync_time_now();
    t->start_time = nVar8;
    (*t->f)(t);
    nVar8 = nsync_time_now();
    nVar8 = nsync_time_sub(nVar8,t->start_time);
    dVar1 = nsync_time_to_dbl(nVar8);
    d = 0.1;
    if (0.1 <= dVar1) {
      d = dVar1;
    }
    iVar3 = ((int)(dVar7 / d) - 1U) * iVar4;
    uVar2 = (int)(dVar7 / d);
    do {
      uVar5 = uVar2;
      dVar1 = (double)(int)uVar5 * d;
      iVar3 = iVar3 + iVar4;
      uVar2 = uVar5 + 1;
    } while (dVar1 * 4.0 < dVar7 * 5.0);
    if ((((int)uVar5 < 2) || (dVar7 * 3.0 <= dVar1 + dVar1)) ||
       ((int)(0x7fffffff / (ulong)uVar5) <= iVar4)) {
      iVar3 = iVar4 << (iVar4 < 0x3fffffff);
    }
    iVar4 = iVar3;
  } while (((t->test_status == 0) && (d < dVar7)) && (iVar4 != t->n));
  nVar8 = nsync_time_from_dbl(d);
  __ptr = nsync_time_str(nVar8,2);
  nVar8 = nsync_time_from_dbl(d / (double)t->n);
  __ptr_00 = nsync_time_str(nVar8,2);
  pcVar6 = "  *** failed ***";
  if (t->test_status == 0) {
    pcVar6 = "";
  }
  fprintf((FILE *)t->fp,"%-50s %9d %8s  %8.2g %8s%s\n",SUB84((double)t->n / d,0),t->name,
          (ulong)(uint)t->n,__ptr,__ptr_00,pcVar6);
  free(__ptr);
  free(__ptr_00);
  finish_run(t);
  return;
}

Assistant:

static void run_benchmark (testing t) {
	char *elapsed_str = 0;
	char *time_per_op_str = 0;
	double elapsed;
	int n = 1;
	double target = 2.0;
	int longshort = testing_longshort (t);
	if (longshort < 0) {
		target = 1e-3 * (2000 >> -longshort);
	} else if (longshort > 0) {
		target = 1e-3 * (2000 << longshort);
	}
	do {
		int32_t mul;
		t->test_status = 0;
		t->n = n;
		t->stop_time = nsync_time_zero;
		t->start_time = nsync_time_now ();
		(*t->f) (t);
		elapsed = nsync_time_to_dbl (nsync_time_sub (nsync_time_now (), t->start_time));
		if (elapsed < 1e-1) {
			elapsed = 1e-1;
		}
		mul = (int32_t) (target / elapsed);
		while (elapsed * mul * 4 < target * 5) {
			mul++;
		}
		if (mul > 1 && elapsed * mul * 2 < target * 3 && n < INT_MAX / mul) {
			n *= mul;
		} else if (n < INT_MAX / 2) {
			n *= 2;
		}
	} while (t->test_status == 0 && elapsed < target && n != t->n);
	elapsed_str = nsync_time_str (nsync_time_from_dbl (elapsed), 2);
	time_per_op_str = nsync_time_str (nsync_time_from_dbl (elapsed / t->n), 2);
	fprintf (t->fp, "%-50s %9d %8s  %8.2g %8s%s\n", t->name, t->n, elapsed_str,
		 ((double)t->n) / elapsed, time_per_op_str,
		 t->test_status != 0 ? "  *** failed ***" : "");
	free (elapsed_str);
	free (time_per_op_str);
	finish_run (t);
}